

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

bool Host_SendAllHere(void *userdata)

{
  sockaddr_in *address;
  int local_70;
  int local_6c;
  int spot;
  int machine;
  sockaddr_in *from;
  int node;
  PreGamePacket packet;
  int *gotack;
  void *userdata_local;
  
  from._4_1_ = '0';
  from._5_1_ = '\x03';
  packet.machines[7] = (anon_struct_8_4_8d968fe9)userdata;
  for (from._0_4_ = 1; (int)from < doomcom.numnodes; from._0_4_ = (int)from + 1) {
    local_70 = 0;
    from._7_1_ = (BYTE)(int)from;
    if (*(int *)((long)packet.machines[7] + (long)(int)from * 4) == 0) {
      local_70 = 0;
      for (local_6c = 1; local_6c < doomcom.numnodes; local_6c = local_6c + 1) {
        if ((int)from != local_6c) {
          packet.machines[(long)local_70 + -1].address = sendaddress[local_6c].sin_addr.s_addr;
          packet.machines[(long)local_70 + -1].port = sendaddress[local_6c].sin_port;
          packet.machines[(long)local_70 + -1].player = from._7_1_;
          local_70 = local_70 + 1;
        }
      }
      from._6_1_ = (char)doomcom.numnodes + -2;
    }
    else {
      from._6_1_ = '\0';
    }
    PreSend((void *)((long)&from + 4),local_70 * 8 + 4,sendaddress + (int)from);
  }
  while (address = PreGet((void *)((long)&from + 4),0x44,false), address != (sockaddr_in *)0x0) {
    if ((from._4_1_ == '0') && (from._5_1_ == '\x06')) {
      from._0_4_ = FindNode(address);
      if ((-1 < (int)from) && (*(int *)((long)packet.machines[7] + (long)(int)from * 4) == 0)) {
        *(undefined4 *)((long)packet.machines[7] + (long)(int)from * 4) = 1;
        *(int *)((long)packet.machines[7] + 0x20) = *(int *)((long)packet.machines[7] + 0x20) + 1;
      }
      PreSend((void *)((long)&from + 4),2,address);
    }
  }
  return *(int *)((long)packet.machines[7] + 0x20) == doomcom.numnodes + -1;
}

Assistant:

bool Host_SendAllHere (void *userdata)
{
	int *gotack = (int *)userdata;	// ackcount is at gotack[MAXNETNODES]
	PreGamePacket packet;
	int node;
	sockaddr_in *from;

	// Send out address information to all guests. Guests that have already
	// acknowledged receipt effectively get just a heartbeat packet.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_ALLHERE;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		int machine, spot = 0;

		packet.ConsoleNum = node;
		if (!gotack[node])
		{
			for (spot = 0, machine = 1; machine < doomcom.numnodes; machine++)
			{
				if (node != machine)
				{
					packet.machines[spot].address = sendaddress[machine].sin_addr.s_addr;
					packet.machines[spot].port = sendaddress[machine].sin_port;
					packet.machines[spot].player = node;

					spot++;	// fixes problem of new address replacing existing address in
							// array; it's supposed to increment the index before getting
							// and storing in the packet the next address.
				}
			}
			packet.NumNodes = doomcom.numnodes - 2;
		}
		else
		{
			packet.NumNodes = 0;
		}
		PreSend (&packet, 4 + spot*8, &sendaddress[node]);
	}

	// Check for replies.
	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake == PRE_FAKE && packet.Message == PRE_ALLHEREACK)
		{
			node = FindNode (from);
			if (node >= 0)
			{
				if (!gotack[node])
				{
					gotack[node] = true;
					gotack[MAXNETNODES]++;
				}
			}
			PreSend (&packet, 2, from);
		}
	}

	// If everybody has replied, then this loop can end.
	return gotack[MAXNETNODES] == doomcom.numnodes - 1;
}